

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::AnonymousProgramSyntax::AnonymousProgramSyntax
          (AnonymousProgramSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endkeyword)

{
  pointer ppMVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  
  uVar7 = semi._0_8_;
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,AnonymousProgram,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->semi).kind = (short)uVar7;
  (this->semi).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->semi).info = semi.info;
  uVar4 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar2 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057dd50;
  (this->endkeyword).kind = endkeyword.kind;
  (this->endkeyword).field_0x2 = endkeyword._2_1_;
  (this->endkeyword).numFlags = (NumericTokenFlags)endkeyword.numFlags.raw;
  (this->endkeyword).rawLen = endkeyword.rawLen;
  (this->endkeyword).info = endkeyword.info;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppMVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr
  ;
  sVar2 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(AnonymousProgramSyntax **)(*(long *)((long)ppMVar1 + lVar6) + 8) = this;
  }
  return;
}

Assistant:

AnonymousProgramSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token semi, const SyntaxList<MemberSyntax>& members, Token endkeyword) :
        MemberSyntax(SyntaxKind::AnonymousProgram, attributes), keyword(keyword), semi(semi), members(members), endkeyword(endkeyword) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }